

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineMemory.cpp
# Opt level: O0

void Diligent::SetRawAllocator(IMemoryAllocator *pRawAllocator)

{
  undefined *puVar1;
  undefined8 uVar2;
  Char *Message;
  undefined1 local_60 [8];
  string msg;
  undefined1 local_30 [8];
  string _msg;
  IMemoryAllocator *pRawAllocator_local;
  
  _msg.field_2._8_8_ = pRawAllocator;
  if (pRawAllocator == (IMemoryAllocator *)0x0) {
    FormatString<char[65]>
              ((string *)local_30,
               (char (*) [65])"User-defined allocator is not provided. Using default allocator.");
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(0,uVar2,0);
    }
    std::__cxx11::string::~string((string *)local_30);
    _msg.field_2._8_8_ = DefaultRawMemoryAllocator::GetAllocator();
  }
  if ((g_pRawAllocator != 0) && (g_pRawAllocator != _msg.field_2._8_8_)) {
    FormatString<char[126]>
              ((string *)local_60,
               (char (*) [126])
               "User-defined allocator has already been provided and does not match the new allocator. This may result in undefined behavior."
              );
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"SetRawAllocator",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/EngineMemory.cpp"
               ,0x33);
    std::__cxx11::string::~string((string *)local_60);
  }
  g_pRawAllocator = _msg.field_2._8_8_;
  return;
}

Assistant:

void SetRawAllocator(IMemoryAllocator* pRawAllocator)
{
    if (pRawAllocator == nullptr)
    {
        LOG_INFO_MESSAGE("User-defined allocator is not provided. Using default allocator.");
        pRawAllocator = &DefaultRawMemoryAllocator::GetAllocator();
    }

    DEV_CHECK_ERR(g_pRawAllocator == nullptr || g_pRawAllocator == pRawAllocator,
                  "User-defined allocator has already been provided and does not match the new allocator. "
                  "This may result in undefined behavior.");

    g_pRawAllocator = pRawAllocator;
}